

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * cargo_get_usage(cargo_t ctx,cargo_usage_t flags)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  char *lb_epilog;
  int indent_1;
  char *description;
  int indent;
  char *lb_desc;
  undefined1 auStack_80 [4];
  int is_default_group;
  cargo_astr_t str;
  cargo_group_t *grp;
  char *short_usage;
  size_t option_count;
  size_t positional_count;
  size_t sStack_38;
  int max_name_len;
  char *b;
  size_t i;
  char *ret;
  cargo_t pcStack_18;
  cargo_usage_t flags_local;
  cargo_t ctx_local;
  
  i = 0;
  sStack_38 = 0;
  positional_count._4_4_ = 0;
  option_count = 0;
  short_usage = (char *)0x0;
  grp = (cargo_group_t *)0x0;
  str.diff = 0;
  ret._4_4_ = flags;
  pcStack_18 = ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x15da,"const char *cargo_get_usage(cargo_t, cargo_usage_t)");
  }
  if (((flags & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL) &&
     (grp = (cargo_group_t *)_cargo_get_short_usage(ctx,flags), grp == (cargo_group_t *)0x0)) {
    return (char *)0x0;
  }
  if ((ret._4_4_ & CARGO_USAGE_SHORT) != CARGO_USAGE_FULL) {
    return (char *)grp;
  }
  positional_count._4_4_ =
       _cargo_get_max_name_length(pcStack_18,&option_count,(size_t *)&short_usage);
  if (positional_count._4_4_ < 0) goto LAB_00108c57;
  _auStack_80 = (char **)&stack0xffffffffffffffc8;
  str.s = (char **)0x400;
  str.l = 0;
  if ((grp != (cargo_group_t *)0x0) && ((ret._4_4_ & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL)) {
    cargo_aappendf((cargo_astr_t *)auStack_80,"%s\n",grp);
  }
  if (((pcStack_18->description != (char *)0x0) &&
      (sVar2 = strlen(pcStack_18->description), sVar2 != 0)) &&
     ((ret._4_4_ & CARGO_USAGE_HIDE_DESCRIPTION) == CARGO_USAGE_FULL)) {
    if ((ret._4_4_ & CARGO_USAGE_RAW_DESCRIPTION) == CARGO_USAGE_FULL) {
      pcVar3 = _cargo_linebreak(pcStack_18,pcStack_18->description,pcStack_18->max_width);
      if (pcVar3 == (char *)0x0) goto LAB_00108c57;
      cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s\n",pcVar3);
      _cargo_free(pcVar3);
    }
    else {
      iVar1 = cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s\n",pcStack_18->description);
      if (iVar1 < 0) goto LAB_00108c57;
    }
  }
  for (b = (char *)0x0; b < (char *)pcStack_18->mutex_group_count; b = b + 1) {
    str.diff = (size_t)(pcStack_18->mutex_groups + (long)b);
    if ((((cargo_group_t *)str.diff)->flags & 2) != 0) {
      if (((cargo_group_t *)str.diff)->title != (char *)0x0) {
        cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s:\n",((cargo_group_t *)str.diff)->title);
      }
      iVar1 = _cargo_get_group_description
                        (pcStack_18,(cargo_astr_t *)auStack_80,(cargo_group_t *)str.diff,2);
      if (((iVar1 != 0) ||
          (iVar1 = _cargo_print_options
                             (pcStack_18,*(size_t **)(str.diff + 0x28),*(size_t *)(str.diff + 0x30),
                              1,(cargo_astr_t *)auStack_80,positional_count._4_4_,2,1,ret._4_4_),
          iVar1 != 0)) ||
         (iVar1 = _cargo_print_options
                            (pcStack_18,*(size_t **)(str.diff + 0x28),*(size_t *)(str.diff + 0x30),0
                             ,(cargo_astr_t *)auStack_80,positional_count._4_4_,2,1,ret._4_4_),
         iVar1 != 0)) goto LAB_00108c57;
    }
  }
  for (b = (char *)0x0; b < (char *)pcStack_18->group_count; b = b + 1) {
    str.diff = (size_t)(pcStack_18->groups + (long)b);
    if (((((cargo_group_t *)str.diff)->flags & 1) == 0) &&
       (((cargo_group_t *)str.diff)->opt_count != 0)) {
      sVar2 = strlen(((cargo_group_t *)str.diff)->name);
      bVar4 = sVar2 == 0;
      if (!bVar4) {
        cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s:",*(undefined8 *)(str.diff + 8));
      }
      if (*(long *)(str.diff + 0x10) != 0) {
        cargo_aappendf((cargo_astr_t *)auStack_80,"\n");
      }
      iVar1 = _cargo_get_group_description
                        (pcStack_18,(cargo_astr_t *)auStack_80,(cargo_group_t *)str.diff,2);
      if ((((iVar1 != 0) ||
           ((option_count != 0 &&
            (((bVar4 && (iVar1 = cargo_aappendf((cargo_astr_t *)auStack_80,"Positional arguments:\n"
                                               ), iVar1 < 0)) ||
             (iVar1 = _cargo_print_options
                                (pcStack_18,*(size_t **)(str.diff + 0x28),
                                 *(size_t *)(str.diff + 0x30),1,(cargo_astr_t *)auStack_80,
                                 positional_count._4_4_,2,0,ret._4_4_), iVar1 != 0)))))) ||
          (iVar1 = cargo_aappendf((cargo_astr_t *)auStack_80,"\n"), iVar1 < 0)) ||
         ((short_usage != (char *)0x0 &&
          (((bVar4 && (iVar1 = cargo_aappendf((cargo_astr_t *)auStack_80,"Options:\n"), iVar1 < 0))
           || (iVar1 = _cargo_print_options
                                 (pcStack_18,*(size_t **)(str.diff + 0x28),
                                  *(size_t *)(str.diff + 0x30),0,(cargo_astr_t *)auStack_80,
                                  positional_count._4_4_,2,0,ret._4_4_), iVar1 != 0))))))
      goto LAB_00108c57;
    }
  }
  if (((pcStack_18->epilog != (char *)0x0) && (sVar2 = strlen(pcStack_18->epilog), sVar2 != 0)) &&
     ((ret._4_4_ & CARGO_USAGE_HIDE_EPILOG) == CARGO_USAGE_FULL)) {
    if ((ret._4_4_ & CARGO_USAGE_RAW_EPILOG) == CARGO_USAGE_FULL) {
      pcVar3 = _cargo_linebreak(pcStack_18,pcStack_18->epilog,pcStack_18->max_width);
      if (pcVar3 == (char *)0x0) goto LAB_00108c57;
      cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s\n",pcVar3);
      _cargo_free(pcVar3);
    }
    else {
      iVar1 = cargo_aappendf((cargo_astr_t *)auStack_80,"\n%s\n",pcStack_18->epilog);
      if (iVar1 < 0) goto LAB_00108c57;
    }
  }
  i = sStack_38;
LAB_00108c57:
  if (i == 0) {
    _cargo_xfree(&stack0xffffffffffffffc8);
  }
  _cargo_xfree(&pcStack_18->usage);
  pcStack_18->usage = (char *)i;
  return (char *)i;
}

Assistant:

const char *cargo_get_usage(cargo_t ctx, cargo_usage_t flags)
{
    char *ret = NULL;
    size_t i;
    char *b = NULL;
    int max_name_len = 0;
    size_t positional_count = 0;
    size_t option_count = 0;
    const char *short_usage = NULL;
    cargo_group_t *grp = NULL;
    cargo_astr_t str;
    int is_default_group = 1;
    assert(ctx);

    if (!(flags & CARGO_USAGE_HIDE_SHORT))
    {
        if (!(short_usage = _cargo_get_short_usage(ctx, flags)))
        {
            CARGODBG(1, "Failed to get short usage\n");
            return NULL;
        }
    }

    // Only show short usage.
    if (flags & CARGO_USAGE_SHORT)
    {
        return short_usage;
    }

    // TODO: Instead of looping over all options at this stage, save the length
    // of all options on add_option, including max_length, positional_count and
    // so on.

    // First get option names and their length.
    // We get the widest one so we know the column width to use
    // for the final result.
    //   --option_a         Some description.
    //   --longer_option_b  Another description...
    // ^-------------------^
    // What should the above width be.
    if ((max_name_len = _cargo_get_max_name_length(ctx,
                        &positional_count, &option_count)) < 0)
    {
        CARGODBG(1, "Failed to get option name max length\n");
        goto fail;
    }

    str.s = &b;
    str.l = 1024;
    str.offset = 0;

    // TODO: Break all this into separate functions.

    if (short_usage && !(flags & CARGO_USAGE_HIDE_SHORT))
    {
        cargo_aappendf(&str, "%s\n", short_usage);
    }

    if(ctx->description && strlen(ctx->description)
       && !(flags & CARGO_USAGE_HIDE_DESCRIPTION))
    {
        if (flags & CARGO_USAGE_RAW_DESCRIPTION)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->description) < 0) goto fail;
        }
        else
        {
            char *lb_desc;
            if (!(lb_desc = _cargo_linebreak(ctx, ctx->description, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_desc);
            _cargo_free(lb_desc);
        }
    }

    CARGODBG(2, "max_name_len = %d, ctx->max_width = %lu\n",
            max_name_len, ctx->max_width);

    #ifdef CARGO_DEBUG
    for (i = 0; i < ctx->group_count; i++)
    {
        CARGODBG(2, "%s: %lu\n",
            ctx->groups[i].name, ctx->groups[i].opt_count);
    }
    #endif

    // Start by printing mutually exclusive groups
    for (i = 0; i < ctx->mutex_group_count; i++)
    {
        int indent = 2;
        const char *description = NULL;
        grp = &ctx->mutex_groups[i];

        if (!(grp->flags & CARGO_MUTEXGRP_GROUP_USAGE))
        {
            continue;
        }

        if (grp->title)
        {
            cargo_aappendf(&str, "\n%s:\n", grp->title);
        }

        description = grp->description;

        if (!description)
        {
            description = "Specify one of the following.";
        }

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Positional.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                1, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }

        // Options.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                0, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }
    }

    for (i = 0; i < ctx->group_count; i++)
    {
        int indent = 2;
        grp = &ctx->groups[i];

        if ((grp->flags & CARGO_GROUP_HIDE) || (grp->opt_count == 0))
        {
            continue;
        }

        // The group name is always set for normal groups.
        // The default group is simply "".
        is_default_group = (strlen(grp->name) == 0);

        if (!is_default_group)
        {
            indent = 2;
        }

        if (!is_default_group) cargo_aappendf(&str, "\n%s:", grp->title);
        if (grp->description) cargo_aappendf(&str, "\n");

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Note, we only show the "Positional arguments" and "Options"
        // titles for the default group. It becomes quite spammy otherwise.
        if (positional_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Positional arguments:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    1, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }

        if (cargo_aappendf(&str, "\n") < 0) goto fail;

        if (option_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Options:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    0, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }
    }

    if(ctx->epilog && strlen(ctx->epilog)
       && !(flags & CARGO_USAGE_HIDE_EPILOG))
    {
        if (flags & CARGO_USAGE_RAW_EPILOG)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->epilog) < 0) goto fail;
        }
        else
        {
            char *lb_epilog;
            if (!(lb_epilog = _cargo_linebreak(ctx, ctx->epilog, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_epilog);
            _cargo_free(lb_epilog);
        }
    }

    // TODO: Realloc the buffer to minimize size.

    ret = b;

fail:
    // A real failure!
    if (!ret)
    {
        _cargo_xfree(&b);
    }

    // Save the usage and destroy it on exit,
    // we want the user to be able to do things like this:
    // printf("%s\nYou're bad at typing!\n", cargo_get_usage(cargo, 0));
    // without leaking memory.
    _cargo_xfree(&ctx->usage);

    ctx->usage = ret;

    return ret;
}